

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O0

GetSupportedFunctionResponseStruct * __thiscall
cfd::js::api::UtilStructApi::GetSupportedFunction::anon_class_1_0_00000001::operator()
          (GetSupportedFunctionResponseStruct *__return_storage_ptr__,anon_class_1_0_00000001 *this)

{
  ulong uVar1;
  uint64_t support_function;
  anon_class_1_0_00000001 *this_local;
  GetSupportedFunctionResponseStruct *result;
  
  GetSupportedFunctionResponseStruct::GetSupportedFunctionResponseStruct(__return_storage_ptr__);
  uVar1 = cfd::GetSupportedFunction();
  __return_storage_ptr__->bitcoin = false;
  if ((uVar1 & 1) != 0) {
    __return_storage_ptr__->bitcoin = true;
  }
  __return_storage_ptr__->elements = false;
  if ((uVar1 & 2) != 0) {
    __return_storage_ptr__->elements = true;
  }
  return __return_storage_ptr__;
}

Assistant:

GetSupportedFunctionResponseStruct UtilStructApi::GetSupportedFunction() {
  auto call_func = []() -> GetSupportedFunctionResponseStruct {
    GetSupportedFunctionResponseStruct result;
    uint64_t support_function = cfd::GetSupportedFunction();
    result.bitcoin = false;
    if (support_function & LibraryFunction::kEnableBitcoin) {
      result.bitcoin = true;
    }
    result.elements = false;
    if (support_function & LibraryFunction::kEnableElements) {
      result.elements = true;
    }
    return result;
  };

  GetSupportedFunctionResponseStruct result;
  result = ExecuteResponseStructApi<GetSupportedFunctionResponseStruct>(
      call_func, std::string(__FUNCTION__));
  return result;
}